

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::ElemType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
          *values,ElemType *out,char *desc)

{
  Result RVar1;
  Enum EVar2;
  Var local_78;
  
  Var::Var(&local_78,var);
  RVar1 = CheckIndex(this,&local_78,
                     (Index)((ulong)((long)(values->
                                           super__Vector_base<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(values->
                                          super__Vector_base<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 2),desc);
  Var::~Var(&local_78);
  if (out != (ElemType *)0x0) {
    EVar2 = Any;
    if (RVar1.enum_ == Ok) {
      if (var->type_ != Index) {
        __assert_fail("is_index()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir.h"
                      ,0x38,"Index wabt::Var::index() const");
      }
      EVar2 = (values->
              super__Vector_base<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
              )._M_impl.super__Vector_impl_data._M_start[(var->field_2).index_].element.enum_;
    }
    (out->element).enum_ = EVar2;
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}